

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O3

void Wlc_NtkPrintInputInfo(Wlc_Ntk_t *pNtk)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  __stream = fopen("abc_blast_input.info","w");
  if (0 < (pNtk->vCis).nSize) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar5 = (pNtk->vCis).pArray[lVar6];
      if (((long)iVar5 < 1) || (pNtk->nObjsAlloc <= iVar5)) goto LAB_00899b8e;
      pWVar1 = pNtk->pObjs + iVar5;
      uVar11 = pWVar1->End;
      uVar8 = pWVar1->Beg;
      iVar5 = uVar11 - uVar8;
      if ((int)uVar11 < (int)uVar8) {
        uVar8 = uVar11;
      }
      iVar2 = -iVar5;
      if (0 < iVar5) {
        iVar2 = iVar5;
      }
      uVar10 = (ulong)uVar7;
      uVar11 = iVar2 + 1;
      uVar12 = (ulong)uVar11;
      do {
        uVar9 = 0x69;
        if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x3) {
          uVar9 = (uint)pNtk->pInits[uVar10];
        }
        pcVar3 = Wlc_ObjName(pNtk,(int)((ulong)((long)pWVar1 - (long)pNtk->pObjs) >> 3) *
                                  -0x55555555);
        fprintf(__stream,"%s[%d] : %c \n",pcVar3,(ulong)uVar8,(ulong)uVar9);
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) {
        uVar11 = 0;
      }
      uVar7 = uVar11 + uVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNtk->vCis).nSize);
  }
  if (0 < (pNtk->vPos).nSize) {
    lVar6 = 0;
    do {
      iVar5 = (pNtk->vPos).pArray[lVar6];
      lVar4 = (long)iVar5;
      if ((lVar4 < 1) || (pNtk->nObjsAlloc <= iVar5)) {
LAB_00899b8e:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs;
      uVar7 = pWVar1[lVar4].End;
      uVar11 = pWVar1[lVar4].Beg;
      iVar5 = uVar7 - uVar11;
      if ((int)uVar7 < (int)uVar11) {
        uVar11 = uVar7;
      }
      if (iVar5 < 0) {
        iVar5 = -iVar5;
      }
      iVar5 = iVar5 + 1;
      do {
        pcVar3 = Wlc_ObjName(pNtk,(int)((ulong)((long)pWVar1 + (lVar4 * 0x18 - (long)pNtk->pObjs))
                                       >> 3) * -0x55555555);
        fprintf(__stream,"%s[%d] : o \n",pcVar3,(ulong)uVar11);
        uVar11 = uVar11 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNtk->vPos).nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj;
    int i, k, nRange, nBeg, nEnd, nBits = 0;
    FILE * output;

    output = fopen("abc_blast_input.info","w");

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            char c = pObj->Type != WLC_OBJ_FO ? 'i' : pNtk->pInits[nBits + k];
            fprintf(output,"%s[%d] : %c \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index , c );
        }
        if (pObj->Type == WLC_OBJ_FO)
            nBits += nRange;
    }

    Wlc_NtkForEachPo( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            fprintf(output,"%s[%d] : o \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index);
        }
    }

    fclose(output);
    return;
}